

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O0

Polygons * SquareHole(Polygons *__return_storage_ptr__,double xOffset)

{
  initializer_list<linalg::vec<double,_2>_> __l;
  initializer_list<linalg::vec<double,_2>_> __l_00;
  allocator<linalg::vec<double,_2>_> local_189;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  vec<double,_2> local_148;
  vec<double,_2> local_138;
  vec<double,_2> local_128;
  vec<double,_2> local_118;
  iterator local_108;
  size_type local_100;
  vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> local_f8;
  allocator<linalg::vec<double,_2>_> local_d9;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0 [3];
  double local_98;
  double local_90;
  vec<double,_2> local_88;
  vec<double,_2> local_78;
  vec<double,_2> local_68;
  vec<double,_2> local_58;
  iterator local_48;
  size_type local_40;
  vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> local_38;
  undefined1 local_19;
  double local_18;
  double xOffset_local;
  Polygons *polys;
  
  local_19 = 0;
  local_18 = xOffset;
  xOffset_local = (double)__return_storage_ptr__;
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::vector(__return_storage_ptr__);
  local_90 = local_18 + 2.0;
  local_98 = 2.0;
  linalg::vec<double,_2>::vec(&local_88,&local_90,&local_98);
  local_b0[0] = local_18 + -2.0;
  local_b8 = 2.0;
  linalg::vec<double,_2>::vec(&local_78,local_b0,&local_b8);
  local_c0 = local_18 + -2.0;
  local_c8 = -2.0;
  linalg::vec<double,_2>::vec(&local_68,&local_c0,&local_c8);
  local_d0 = local_18 + 2.0;
  local_d8 = -2.0;
  linalg::vec<double,_2>::vec(&local_58,&local_d0,&local_d8);
  local_48 = &local_88;
  local_40 = 4;
  std::allocator<linalg::vec<double,_2>_>::allocator(&local_d9);
  __l_00._M_len = local_40;
  __l_00._M_array = local_48;
  std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::vector
            (&local_38,__l_00,&local_d9);
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::push_back(__return_storage_ptr__,&local_38);
  std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::~vector(&local_38);
  std::allocator<linalg::vec<double,_2>_>::~allocator(&local_d9);
  local_150 = local_18 + -1.0;
  local_158 = 1.0;
  linalg::vec<double,_2>::vec(&local_148,&local_150,&local_158);
  local_160 = local_18 + 1.0;
  local_168 = 1.0;
  linalg::vec<double,_2>::vec(&local_138,&local_160,&local_168);
  local_170 = local_18 + 1.0;
  local_178 = -1.0;
  linalg::vec<double,_2>::vec(&local_128,&local_170,&local_178);
  local_180 = local_18 + -1.0;
  local_188 = -1.0;
  linalg::vec<double,_2>::vec(&local_118,&local_180,&local_188);
  local_108 = &local_148;
  local_100 = 4;
  std::allocator<linalg::vec<double,_2>_>::allocator(&local_189);
  __l._M_len = local_100;
  __l._M_array = local_108;
  std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::vector
            (&local_f8,__l,&local_189);
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::push_back(__return_storage_ptr__,&local_f8);
  std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::~vector(&local_f8);
  std::allocator<linalg::vec<double,_2>_>::~allocator(&local_189);
  return __return_storage_ptr__;
}

Assistant:

Polygons SquareHole(double xOffset) {
  Polygons polys;
  polys.push_back({
      {2 + xOffset, 2},    //
      {-2 + xOffset, 2},   //
      {-2 + xOffset, -2},  //
      {2 + xOffset, -2},   //
  });
  polys.push_back({
      {-1 + xOffset, 1},   //
      {1 + xOffset, 1},    //
      {1 + xOffset, -1},   //
      {-1 + xOffset, -1},  //
  });
  return polys;
}